

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infinite_impulse_response_digital_filter.cc
# Opt level: O0

bool __thiscall
sptk::InfiniteImpulseResponseDigitalFilter::Run
          (InfiniteImpulseResponseDigitalFilter *this,double input,double *output,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  long in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  int p_1;
  int i_1;
  double y;
  double *b;
  int p;
  int i;
  double x;
  double *a;
  double *d;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff90;
  double dVar5;
  size_type in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar6;
  double local_58;
  bool local_1;
  
  if ((((*(byte *)((long)in_RDI + 0x44) & 1) == 0) || (in_RSI == (double *)0x0)) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDX + 8));
    if (sVar2 != (long)(*(int *)(in_RDI + 8) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
      __last._M_current._4_4_ = in_stack_ffffffffffffff8c;
      __last._M_current._0_4_ = in_stack_ffffffffffffff88;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_ffffffffffffff90,__last,in_RDI);
      *(undefined4 *)(in_RDX + 0x20) = 0;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 8),0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 1),0);
    local_58 = -in_XMM0_Qa * *pvVar4;
    iVar1 = *(int *)(in_RDX + 0x20);
    for (iVar6 = 1; iVar6 <= *(int *)(in_RDI + 7); iVar6 = iVar6 + 1) {
      anon_unknown.dwarf_6fca::MovePointer(*(int *)(in_RDI + 8),(int *)&stack0xffffffffffffffa0);
      local_58 = pvVar3[iVar1] * pvVar4[iVar6] + local_58;
    }
    pvVar3[*(int *)(in_RDX + 0x20)] = -local_58;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),0);
    dVar5 = 0.0;
    iVar1 = *(int *)(in_RDX + 0x20) + 1;
    for (iVar6 = 0; iVar6 <= *(int *)((long)in_RDI + 0x3c); iVar6 = iVar6 + 1) {
      anon_unknown.dwarf_6fca::MovePointer(*(int *)(in_RDI + 8),(int *)&stack0xffffffffffffff88);
      dVar5 = pvVar3[iVar1] * pvVar4[iVar6] + dVar5;
    }
    *in_RSI = dVar5;
    *(int *)(in_RDX + 0x20) = *(int *)(in_RDX + 0x20) + 1;
    if (*(int *)(in_RDI + 8) < *(int *)(in_RDX + 0x20)) {
      *(undefined4 *)(in_RDX + 0x20) = 0;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool InfiniteImpulseResponseDigitalFilter::Run(
    double input, double* output,
    InfiniteImpulseResponseDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || NULL == output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_ + 1)) {
    buffer->d_.resize(num_filter_order_ + 1);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
    buffer->p_ = 0;
  }

  double* d(&buffer->d_[0]);

  {
    const double* a(&(denominator_coefficients_[0]));
    double x(-input * a[0]);
    for (int i(1), p(buffer->p_); i <= num_denominator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      x += d[p] * a[i];
    }
    d[buffer->p_] = -x;
  }

  {
    const double* b(&(numerator_coefficients_[0]));
    double y(0.0);
    for (int i(0), p(buffer->p_ + 1); i <= num_numerator_order_; ++i) {
      MovePointer(num_filter_order_, &p);
      y += d[p] * b[i];
    }
    *output = y;
  }

  // Update pointer of ring buffer.
  ++(buffer->p_);
  if (num_filter_order_ < buffer->p_) {
    buffer->p_ = 0;
  }

  return true;
}